

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiAreaPrivate::highlightNextSubWindow(QMdiAreaPrivate *this,int increaseFactor)

{
  QWidget *p;
  qsizetype qVar1;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_00;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QMdiSubWindow *highlight;
  QMdiSubWindow *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->childWindows).d.size != 1) {
    p = *(QWidget **)
         &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
          field_0x8;
    if (this->indexToHighlighted < 0) {
      local_38 = QMdiArea::currentSubWindow((QMdiArea *)p);
      if (local_38 == (QMdiSubWindow *)0x0) goto LAB_00449c9f;
      qVar1 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                        (&this->childWindows,&local_38,0);
      this->indexToHighlighted = (int)qVar1;
    }
    local_38 = nextVisibleSubWindow
                         (this,increaseFactor,this->activationOrder,-1,this->indexToHighlighted);
    if (local_38 != (QMdiSubWindow *)0x0) {
      if (this->rubberBand == (QRubberBand *)0x0) {
        this_00.m_data = operator_new(0x28);
        QRubberBand::QRubberBand((QRubberBand *)this_00.m_data,Rectangle,p);
        this->rubberBand = (QRubberBand *)this_00;
        QVar2.m_size = (size_t)"qt_rubberband";
        QVar2.field_0.m_data = this_00.m_data;
        QObject::setObjectName(QVar2);
        QWidget::setWindowFlags
                  (&this->rubberBand->super_QWidget,
                   (WindowFlags)
                   ((((this->rubberBand->super_QWidget).data)->window_flags).
                    super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>
                    .i | 0x40000));
      }
      if ((this->tabToPreviousTimer).m_id == Invalid) {
        showRubberBandFor(this,local_38);
      }
      qVar1 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                        (&this->childWindows,&local_38,0);
      this->indexToHighlighted = (int)qVar1;
    }
  }
LAB_00449c9f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::highlightNextSubWindow(int increaseFactor)
{
    if (childWindows.size() == 1)
        return;

    Q_Q(QMdiArea);
    // There's no highlighted sub-window atm, use current.
    if (indexToHighlighted < 0) {
        QMdiSubWindow *current = q->currentSubWindow();
        if (!current)
            return;
        indexToHighlighted = childWindows.indexOf(current);
    }

    Q_ASSERT(indexToHighlighted >= 0);
    Q_ASSERT(indexToHighlighted < childWindows.size());

    QMdiSubWindow *highlight = nextVisibleSubWindow(increaseFactor, activationOrder, -1, indexToHighlighted);
    if (!highlight)
        return;

#if QT_CONFIG(rubberband)
    if (!rubberBand) {
        rubberBand = new QRubberBand(QRubberBand::Rectangle, q);
        // For accessibility to identify this special widget.
        rubberBand->setObjectName("qt_rubberband"_L1);
        rubberBand->setWindowFlags(rubberBand->windowFlags() | Qt::WindowStaysOnTopHint);
    }
#endif

    // Only highlight if we're not switching back to the previously active window (Ctrl-Tab once).
#if QT_CONFIG(rubberband)
    if (!tabToPreviousTimer.isActive())
        showRubberBandFor(highlight);
#endif

    indexToHighlighted = childWindows.indexOf(highlight);
    Q_ASSERT(indexToHighlighted >= 0);
}